

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::IndexStorageInfo,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  IndexStorageInfo val;
  IndexStorageInfo local_d0;
  
  (__return_storage_ptr__->
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>).
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      IndexStorageInfo::Deserialize(&local_d0,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::
      emplace_back<duckdb::IndexStorageInfo>
                (&__return_storage_ptr__->
                  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
                 &local_d0);
      ::std::
      vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
      ::~vector(&local_d0.buffers.
                 super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
               );
      ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
      ::~vector(&local_d0.allocator_infos.
                 super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
               );
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_d0.options._M_h);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
        operator_delete(local_d0.name._M_dataplus._M_p);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}